

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O3

int rtr_receive_pdu(rtr_socket *rtr_socket,void *pdu,size_t pdu_len,time_t timeout)

{
  uint uVar1;
  code *pcVar2;
  rtr_socket *prVar3;
  byte bVar4;
  char cVar5;
  uint16_t uVar7;
  int iVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  uint uVar9;
  int iVar10;
  uint32_t uVar11;
  char *pcVar12;
  char cVar13;
  long lVar14;
  void **ary;
  rtr_socket_state rVar15;
  void *pdu_00;
  ulong uVar16;
  uint *in_R8;
  char *pcVar17;
  uint uVar18;
  __pthread_unwind_buf_t *__buf;
  ulong uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  pdu_header header;
  char txt [43];
  long in_stack_00010078;
  char *pcStack_78;
  undefined8 local_70;
  undefined4 local_68;
  uint uStack_64;
  undefined1 auStack_60 [40];
  undefined8 local_38;
  undefined2 uVar6;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = -1;
  if (rtr_socket->state == RTR_SHUTDOWN) goto LAB_00109d7e;
  iVar8 = tr_recv_all(rtr_socket->tr_socket,pdu,8,pdu_len);
  if (iVar8 < 0) {
LAB_00109e9e:
    if (iVar8 == -3) {
      lrtr_dbg("RTR Socket: receive call interrupted");
      iVar10 = -3;
      goto LAB_00109d7e;
    }
    if (iVar8 == -2) {
      lrtr_dbg("RTR Socket: receive timeout expired");
      iVar10 = -2;
      goto LAB_00109d7e;
    }
    if (iVar8 != -1) goto LAB_00109d6c;
    rVar15 = RTR_ERROR_TRANSPORT;
    goto LAB_00109d74;
  }
  local_70 = *pdu;
  __buf = (__pthread_unwind_buf_t *)&local_70;
  rtr_pdu_convert_header_byte_order(__buf,TO_HOST_HOST_BYTE_ORDER);
  uVar9 = local_70._4_4_;
  if (local_70._4_4_ < 8) goto LAB_00109cdb;
  if (0xffff < local_70._4_4_) {
    lrtr_dbg("RTR Socket: PDU too big");
    pcVar17 = (char *)&local_68;
    snprintf(pcVar17,0x2b,"PDU too big, max. PDU size is: %lu bytes");
    lrtr_dbg("RTR Socket: %s",pcVar17);
    uVar11 = 0x2b;
    goto LAB_00109d67;
  }
  bVar4 = local_70._1_1_;
  if (rtr_socket->has_received_pdus == false) {
    if (local_70._1_1_ != 10) {
      uVar1 = rtr_socket->version;
      __buf = (__pthread_unwind_buf_t *)((ulong)local_70 & 0xff);
      uVar18 = (uint)(byte)local_70;
      if (((byte)local_70 <= uVar1 && uVar1 != uVar18) && (byte)local_70 < 3) {
        lrtr_dbg("RTR Socket: First received PDU is a version %u PDU, downgrading from version %u to %u"
                 ,(ulong)uVar18,(ulong)uVar1,(ulong)uVar18);
        rtr_socket->version = uVar18;
      }
    }
    rtr_socket->has_received_pdus = true;
  }
  pdu_00 = (void *)((ulong)local_70 & 0xff);
  if (rtr_socket->version != (uint)(byte)local_70 && bVar4 != 10) {
    lrtr_dbg("RTR Socket: PDU with unexpected Protocol version (%u) received");
    rtr_send_error_pdu(rtr_socket,pdu,8,UNEXPECTED_PROTOCOL_VERSION,(char *)0x0,0);
    goto LAB_00109d7e;
  }
  if (uVar9 - 8 != 0) {
    if (rtr_socket->state == RTR_SHUTDOWN) goto LAB_00109d7e;
    pdu_00 = (void *)((long)pdu + 8);
    iVar8 = tr_recv_all(rtr_socket->tr_socket,pdu_00,(ulong)(uVar9 - 8),0x3c);
    if (iVar8 < 0) goto LAB_00109e9e;
  }
  prVar3 = local_70;
  *(rtr_socket **)pdu = local_70;
  pcVar17 = "RTR Socket: PDU type is unknown or reserved!";
  if (0xb < (byte)((ulong)local_70 >> 8)) goto switchD_00109e8e_caseD_5;
  pcVar12 = (char *)((ulong)local_70 >> 0x20);
  uVar19 = (ulong)local_70 >> 8 & 0xff;
  lVar14 = (long)(int)(&switchD_00109e8e::switchdataD_00115f64)[uVar19];
  ary = (void **)((long)&switchD_00109e8e::switchdataD_00115f64 + lVar14);
  cVar5 = (char)((ulong)local_70 >> 0x20);
  uVar6 = (undefined2)((ulong)local_70 >> 0x20);
  iVar10 = (int)((ulong)local_70 >> 0x20);
  cVar13 = (char)ary;
  switch(uVar19) {
  case 0:
  case 1:
switchD_00109e8e_caseD_0:
    if (iVar10 == 0xc) break;
    goto LAB_0010a0bb;
  case 2:
  case 3:
  case 8:
    if (iVar10 != 8) goto LAB_0010a0bb;
    break;
  case 4:
    if (iVar10 != 0x14) goto LAB_0010a0bb;
    break;
  case 5:
    goto switchD_00109e8e_caseD_5;
  case 6:
    if (iVar10 != 0x20) goto LAB_0010a0bb;
    break;
  case 7:
    if ((byte)local_70 == 0) goto switchD_00109e8e_caseD_0;
    if (2 < (byte)local_70 || iVar10 != 0x18) goto LAB_0010a0bb;
    break;
  case 9:
    if (iVar10 != 0x7b) goto LAB_0010a0bb;
    break;
  case 10:
    if ((ulong)local_70 >> 0x24 == 0) {
      pcVar17 = "RTR Socket: PDU is too small to contain \"Length of Error Text\" field!";
    }
    else {
      uVar9 = *(uint *)((long)pdu + 8);
      uVar19 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                      uVar9 << 0x18);
      lrtr_dbg("RTR Socket: enc_pdu_len: %u",uVar19);
      if ((ulong)*(uint *)((long)pdu + 4) < uVar19 + 0x10) {
        pcVar17 = "RTR Socket: PDU is too small to contain erroneous PDU!";
      }
      else {
        uVar9 = *(uint *)((long)pdu + uVar19 + 0xc);
        uVar16 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                        uVar9 << 0x18);
        lrtr_dbg("RTR Socket: err_msg_len: %u",uVar16);
        if (uVar19 + 0x10 + uVar16 == (ulong)*(uint *)((long)pdu + 4)) break;
        pcVar17 = "RTR Socket: PDU is too small to contain error_msg!";
      }
    }
    goto switchD_00109e8e_caseD_5;
  case 0xb:
    if ((ulong)local_70 >> 0x24 == 0) {
      pcVar17 = "RTR Socket: PDU is too small to contain ASPA PDU!";
    }
    else {
      if ((uint)(ushort)(*(ushort *)((long)pdu + 10) << 8 | *(ushort *)((long)pdu + 10) >> 8) * 4 +
          0x10 == iVar10) break;
      pcVar17 = 
      "RTR Socket: The PDU is malformed, because the specified size doesn\'t match the real PDU size."
      ;
    }
switchD_00109e8e_caseD_5:
    lrtr_dbg(pcVar17);
LAB_0010a0bb:
    lrtr_dbg("RTR Socket: Received malformed PDU!");
LAB_00109cdb:
    lrtr_dbg("RTR Socket: corrupt PDU received");
    pcVar17 = "corrupt data received, length value in PDU is too small";
    uVar11 = 0x38;
LAB_00109d67:
    rtr_send_error_pdu(rtr_socket,pdu,8,CORRUPT_DATA,pcVar17,uVar11);
LAB_00109d6c:
    rVar15 = RTR_ERROR_FATAL;
LAB_00109d74:
    rtr_change_socket_state(rtr_socket,rVar15);
    goto LAB_00109d79;
  case 0xc:
    pcVar17 = "RTR Socket: Error PDU received";
    pcStack_78 = pcVar12;
    goto code_r0x0010a0f1;
  case 0xd:
    halt_baddata();
  case 0xe:
    halt_baddata();
  case 0xf:
    goto switchD_00109e8e_caseD_f;
  case 0x10:
    *pcVar12 = *pcVar12 + cVar5;
code_r0x0010a0f1:
    lrtr_dbg(pcVar17);
    switch(*(undefined2 *)((long)&rtr_socket->tr_socket + 2)) {
    case 0:
      pcVar17 = "RTR Socket: Corrupt data received";
      break;
    case 1:
      pcVar17 = "RTR Socket: Internal error on server-side";
      break;
    case 2:
      lrtr_dbg("RTR Socket: No data available");
      rVar15 = RTR_ERROR_NO_DATA_AVAIL;
      goto LAB_0010a1ab;
    case 3:
      pcVar17 = "RTR Socket: Invalid request from client";
      break;
    case 4:
      lrtr_dbg("RTR Socket: Client uses unsupported protocol version");
      if ((uint)*(byte *)&rtr_socket->tr_socket < *(uint *)((long)pdu + 0x60) &&
          *(byte *)&rtr_socket->tr_socket < 3) {
        pcVar17 = "RTR Socket: Downgrading from %i to version %i";
switchD_00109e8e_caseD_f:
        lrtr_dbg(pcVar17);
        *(uint *)((long)pdu + 0x60) = (uint)*(byte *)&rtr_socket->tr_socket;
        pdu_00 = (void *)0x4;
code_r0x0010a169:
        rVar15 = (rtr_socket_state)pdu_00;
        goto LAB_0010a1ab;
      }
      lrtr_dbg(
              "RTR Socket: Got UNSUPPORTED_PROTOCOL_VER error PDU with invalid values, current version:%i, PDU version:%i"
              );
      goto LAB_0010a1a3;
    case 5:
      pcVar17 = "RTR Socket: Client set unsupported PDU type";
      break;
    default:
      lrtr_dbg("RTR Socket: error unknown, server sent unsupported error code %u");
      goto LAB_0010a1a3;
    }
    lrtr_dbg(pcVar17);
LAB_0010a1a3:
    rVar15 = RTR_ERROR_FATAL;
LAB_0010a1ab:
    rtr_change_socket_state((rtr_socket *)pdu,rVar15);
    uVar19 = (ulong)rtr_socket->refresh_interval;
    uVar16 = (ulong)*(uint *)(&rtr_socket->field_0xc + uVar19);
    if (uVar16 == 0) {
      if (*(char **)(in_FS_OFFSET + 0x28) == pcStack_78) {
        return (int)*(char **)(in_FS_OFFSET + 0x28);
      }
    }
    else if (uVar19 + uVar16 + 0x10 == (ulong)*(uint *)((long)&rtr_socket->tr_socket + 4)) {
      if (*(char **)(in_FS_OFFSET + 0x28) == pcStack_78) {
        lrtr_dbg("RTR Socket: Error PDU included the following error msg: \'%.*s\'",uVar16,
                 (long)&rtr_socket->last_update + uVar19);
        return extraout_EAX;
      }
    }
    else if (*(char **)(in_FS_OFFSET + 0x28) == pcStack_78) {
      lrtr_dbg("RTR Socket: error: Length of error text contains an incorrect value");
      return extraout_EAX_00;
    }
    __stack_chk_fail();
  case 0x11:
    *pcVar12 = *pcVar12 + cVar5;
    pdu = pcVar17;
    goto code_r0x0010a169;
  case 0x12:
    out(0x5f64,iVar10);
    goto LAB_0010a3b1;
  default:
    pcVar12[-0x73] = pcVar12[-0x73] + cVar13;
    halt_baddata();
  case 0x16:
    pcVar12[-1] = pcVar12[-1] + (char)((ulong)rtr_socket >> 8);
    goto code_r0x0010a413;
  case 0x18:
    goto code_r0x0010a42e;
  case 0x19:
    pcVar12 = (char *)(ulong)CONCAT22(header.reserved,CONCAT11(header.type,header.ver));
    goto switchD_0010a43c_caseD_1;
  case 0x1b:
    halt_baddata();
  case 0x1c:
    goto switchD_00109e8e_caseD_1c;
  case 0x1d:
    iVar10 = rtr_store_prefix_pdu
                       ((rtr_socket *)"RTR Socket: PDU type is unknown or reserved!",pdu_00,0x115f64
                        ,ary,in_R8,(uint *)&stack0xffffffffffffffec);
    rtr_socket = (rtr_socket *)(ulong)uStack_64;
    pcVar17 = (char *)__buf;
    if (iVar10 == -1) {
      rtr_change_socket_state(local_70,RTR_ERROR_FATAL);
      iVar10 = (int)pdu;
      goto LAB_0010a97e;
    }
switchD_00109e8e_caseD_1c:
    pdu = (void *)0x0;
    iVar10 = __sigsetjmp(pcVar17,0);
    if (iVar10 == 0) {
LAB_0010a3b1:
      uStack_64 = (uint)rtr_socket;
      __pthread_register_cancel(__buf);
      pthread_setcancelstate((int)pdu,(int *)((long)&local_38 + 4));
      uVar9 = rtr_receive_pdu(local_70,&header,0x3c,(time_t)ary);
      pdu = (void *)(ulong)uVar9;
      pthread_setcancelstate(1,(int *)((long)&local_38 + 4));
      __pthread_unregister_cancel(__buf);
      if (uVar9 != 0xfffffffe) {
        pcVar12 = (char *)0xffffffff;
code_r0x0010a413:
        if ((int)pdu < 0) {
          iVar10 = (int)pcVar12;
        }
        else {
          pcVar12 = (char *)(ulong)header.type;
          if (pcVar12 < (char *)0xc) {
code_r0x0010a42e:
            iVar10 = (*(code *)((long)&switchD_0010a43c::switchdataD_00115fac +
                               (long)(int)(&switchD_0010a43c::switchdataD_00115fac)[(long)pcVar12]))
                               ();
            return iVar10;
          }
switchD_0010a43c_caseD_1:
          lrtr_dbg("RTR Socket: Received unexpected PDU (Type: %u)",pcVar12);
          rtr_pdu_convert_header_byte_order(&stack0x00010008,TO_NETWORK_BYTE_ORDER);
          rtr_send_error_pdu(local_70,&stack0x00010008,8,CORRUPT_DATA,
                             "Unexpected PDU received during data synchronisation",0x34);
          iVar10 = -1;
        }
        goto LAB_0010a97e;
      }
    }
    else {
      recv_loop_cleanup(auStack_60);
      __pthread_unwind_next((__pthread_unwind_buf_t *)&stack0x00010008);
    }
    rtr_change_socket_state(local_70,RTR_ERROR_TRANSPORT);
    iVar10 = -1;
LAB_0010a97e:
    recv_loop_cleanup(auStack_60);
    if (*(long *)(in_FS_OFFSET + 0x28) != in_stack_00010078) {
      __stack_chk_fail();
    }
    return iVar10;
  case 0x1e:
  case 0x1f:
    pcVar12[-0x77] = pcVar12[-0x77] + cVar13;
    goto switchD_0010af74_caseD_2;
  case 0x20:
  case 0x21:
  case 0x23:
  case 0x26:
    if (SCARRY8(lVar14,0x115f64) == (long)ary < 0) {
      *pcVar12 = *pcVar12 - cVar5;
      *pcVar12 = *pcVar12 + cVar5;
    }
    else {
      *pcVar12 = *pcVar12 + cVar5;
      *(undefined2 *)((long)&rtr_socket->refresh_interval + 2) = uVar6;
      uVar11 = lrtr_convert_long(~TO_NETWORK_BYTE_ORDER,*(uint32_t *)&rtr_socket->field_0xc);
      *(uint32_t *)&rtr_socket->field_0xc = uVar11;
      uVar7 = lrtr_convert_short(TO_HOST_HOST_BYTE_ORDER,
                                 *(uint16_t *)((long)&rtr_socket->refresh_interval + 2));
      if (uVar7 != 0) {
        uVar19 = 0;
        do {
          uVar11 = lrtr_convert_long(~TO_NETWORK_BYTE_ORDER,
                                     *(uint32_t *)((long)&rtr_socket->last_update + uVar19 * 4));
          *(uint32_t *)((long)&rtr_socket->last_update + uVar19 * 4) = uVar11;
          uVar19 = uVar19 + 1;
        } while (uVar7 != uVar19);
      }
    }
    goto switchD_0010af74_caseD_2;
  case 0x22:
    *(uint *)(lVar14 + 0x22c60e) = *(uint *)(lVar14 + 0x22c60e) | (uint)pdu_00;
    rtr_socket = (rtr_socket *)
                 CONCAT62((int6)((ulong)rtr_socket >> 0x10),CONCAT11(0x73,(char)rtr_socket));
    *pcVar12 = *pcVar12 + cVar5;
    *(undefined2 *)((long)&rtr_socket->tr_socket + 2) = uVar6;
    pdu_00 = (void *)(ulong)*(uint *)((long)&rtr_socket->tr_socket + 4);
    bVar20 = *(char **)(in_FS_OFFSET + 0x28) == pcStack_78;
    goto code_r0x0010af20;
  case 0x24:
    *(char *)(lVar14 + -0x3f659859) = *(char *)(lVar14 + -0x3f659859) + cVar13;
    uVar11 = lrtr_convert_long(TO_HOST_HOST_BYTE_ORDER,
                               *(uint32_t *)(&rtr_socket->field_0xc + (long)pcVar12));
    pcVar12 = (char *)(ulong)uVar11;
    ary = (void **)(ulong)rtr_socket->refresh_interval;
  case 0x27:
    *(int *)(&rtr_socket->field_0xc + (long)ary) = (int)pcVar12;
switchD_0010af74_caseD_2:
    if (*(long *)(in_FS_OFFSET + 0x28) != CONCAT44(uStack_64,local_68)) {
      __stack_chk_fail();
    }
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  case 0x25:
    bVar20 = cVar5 == -0x24;
code_r0x0010af20:
    if (!bVar20) {
      __stack_chk_fail();
    }
    uVar11 = lrtr_convert_long(~TO_NETWORK_BYTE_ORDER,(uint32_t)pdu_00);
    *(uint32_t *)((long)&rtr_socket->tr_socket + 4) = uVar11;
    return uVar11;
  case 0x28:
    *pcVar12 = *pcVar12 + cVar5;
    iVar10 = (*(code *)((long)&switchD_0010af74::switchdataD_00115fdc +
                       (long)(int)(&switchD_0010af74::switchdataD_00115fdc)[(long)pcVar12]))();
    return iVar10;
  case 0x29:
    pcVar2 = (code *)swi(1);
    iVar10 = (*pcVar2)();
    return iVar10;
  }
  rtr_pdu_convert_footer_byte_order(pdu,TO_HOST_HOST_BYTE_ORDER);
  if ((bVar4 & 0xfd) == 4) {
    if (*(char *)((long)pdu + 0xb) == '\0') {
      iVar10 = 0;
      goto LAB_00109d7e;
    }
    pcVar17 = "RTR Socket: Warning: Zero field of received Prefix PDU doesn\'t contain 0";
  }
  else {
    iVar10 = 0;
    if (bVar4 == 9) {
      if (*(char *)((long)pdu + 3) == '\0') goto LAB_00109d7e;
      pcVar17 = "RTR Socket: Warning: ROUTER_KEY_PDU zero field is != 0";
    }
    else {
      if (bVar4 != 0xb) goto LAB_00109d7e;
      if (*pdu != '\x02') {
        lrtr_dbg("RTR Socket: PDU with unsupported Protocol version (%u) received",
                 (ulong)prVar3 & 0xff);
        rtr_send_error_pdu(rtr_socket,pdu,8,UNSUPPORTED_PROTOCOL_VER,(char *)0x0,0);
LAB_00109d79:
        iVar10 = -1;
        goto LAB_00109d7e;
      }
      if (*(short *)((long)pdu + 2) != 0) {
        lrtr_dbg("RTR Socket: Warning: Zero field of received ASPA PDU doesn\'t contain 0");
      }
      if (*(char *)((long)pdu + 9) == '\x03') goto LAB_00109d7e;
      pcVar17 = "RTR Socket: Warning: AFI flags of received ASPA PDU not set to 0x03";
    }
  }
  iVar10 = 0;
  lrtr_dbg(pcVar17);
LAB_00109d7e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar10;
}

Assistant:

static int rtr_receive_pdu(struct rtr_socket *rtr_socket, void *pdu, const size_t pdu_len, const time_t timeout)
{
	int error = RTR_SUCCESS;

	assert(pdu_len >= RTR_MAX_PDU_LEN);

	if (rtr_socket->state == RTR_SHUTDOWN)
		return RTR_ERROR;
	// receive packet header
	error = tr_recv_all(rtr_socket->tr_socket, pdu, sizeof(struct pdu_header), timeout);
	if (error < 0)
		goto error;
	else
		error = RTR_SUCCESS;

	// header in hostbyte order, retain original received pdu, in case we need to detach it to an error pdu
	struct pdu_header header;

	memcpy(&header, pdu, sizeof(header));
	rtr_pdu_header_to_host_byte_order(&header);

	// if header->len is < packet_header = corrupt data received
	if (header.len < sizeof(header)) {
		error = CORRUPT_DATA;
		goto error;
	} else if (header.len > RTR_MAX_PDU_LEN) { // PDU too big, > than MAX_PDU_LEN Bytes
		error = PDU_TOO_BIG;
		goto error;
	}

	// Handle live downgrading
	if (!rtr_socket->has_received_pdus) {
		if (header.type != ERROR && rtr_socket->version > header.ver && rtr_version_supported(header.ver)) {
			RTR_DBG("First received PDU is a version %u PDU, downgrading from version %u to %u", header.ver,
				rtr_socket->version, header.ver);
			rtr_socket->version = header.ver;
		}
		rtr_socket->has_received_pdus = true;
	}

	// Handle wrong protocol version
	// If it is a error PDU, it will be handled by rtr_handle_error_pdu
	if (header.ver != rtr_socket->version && header.type != ERROR) {
		error = UNEXPECTED_PROTOCOL_VERSION;
		goto error;
	}

	// receive packet payload
	const unsigned int remaining_len = header.len - sizeof(header);

	if (remaining_len > 0) {
		if (rtr_socket->state == RTR_SHUTDOWN)
			return RTR_ERROR;
		error = tr_recv_all(rtr_socket->tr_socket, (((char *)pdu) + sizeof(header)), remaining_len,
				    RTR_RECV_TIMEOUT);
		if (error < 0)
			goto error;
		else
			error = RTR_SUCCESS;
	}
	// copy header in host_byte_order to pdu
	memcpy(pdu, &header, sizeof(header));

	// Check if the header len value is valid
	if (rtr_pdu_check_size(pdu) == false) {
		// TODO Restore byteorder for sending error PDU
		error = CORRUPT_DATA;
		goto error;
	}
	// At this point it is save to cast and use the PDU

	rtr_pdu_footer_to_host_byte_order(pdu);

	// Here we should handle error PDUs instead of doing it in
	// several other places...

	if (header.type == IPV4_PREFIX || header.type == IPV6_PREFIX) {
		if (((struct pdu_ipv4 *)pdu)->zero != 0)
			RTR_DBG1("Warning: Zero field of received Prefix PDU doesn't contain 0");
	}
	if (header.type == ASPA) {
		if (((struct pdu_aspa *)pdu)->ver != RTR_PROTOCOL_VERSION_2) {
			error = UNSUPPORTED_PROTOCOL_VER;
			goto error;
		}

		if (((struct pdu_aspa *)pdu)->zero != 0)
			RTR_DBG1("Warning: Zero field of received ASPA PDU doesn't contain 0");

		if (((struct pdu_aspa *)pdu)->afi_flags != 0b11)
			RTR_DBG1("Warning: AFI flags of received ASPA PDU not set to 0x03");
	}
	if (header.type == ROUTER_KEY && ((struct pdu_router_key *)pdu)->zero != 0)
		RTR_DBG1("Warning: ROUTER_KEY_PDU zero field is != 0");

	return RTR_SUCCESS;

error:
	// send error msg to server, including unmodified pdu header(pdu variable instead header)
	if (error == -1) {
		rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
		return RTR_ERROR;
	} else if (error == TR_WOULDBLOCK) {
		RTR_DBG1("receive timeout expired");
		return TR_WOULDBLOCK;
	} else if (error == TR_INTR) {
		RTR_DBG1("receive call interrupted");
		return TR_INTR;
	} else if (error == CORRUPT_DATA) {
		RTR_DBG1("corrupt PDU received");
		const char txt[] = "corrupt data received, length value in PDU is too small";

		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), CORRUPT_DATA, txt, sizeof(txt));
	} else if (error == PDU_TOO_BIG) {
		RTR_DBG1("PDU too big");
		char txt[43];

		snprintf(txt, sizeof(txt), "PDU too big, max. PDU size is: %lu bytes", RTR_MAX_PDU_LEN);
		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), CORRUPT_DATA, txt, sizeof(txt));
	} else if (error == UNSUPPORTED_PDU_TYPE) {
		RTR_DBG("Unsupported PDU type (%u) received", header.type);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNSUPPORTED_PDU_TYPE, NULL, 0);
	} else if (error == UNSUPPORTED_PROTOCOL_VER) {
		RTR_DBG("PDU with unsupported Protocol version (%u) received", header.ver);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNSUPPORTED_PROTOCOL_VER, NULL, 0);
		return RTR_ERROR;
	} else if (error == UNEXPECTED_PROTOCOL_VERSION) {
		RTR_DBG("PDU with unexpected Protocol version (%u) received", header.ver);
		rtr_send_error_pdu_from_network(rtr_socket, pdu, sizeof(header), UNEXPECTED_PROTOCOL_VERSION, NULL, 0);
		return RTR_ERROR;
	}

	rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
	return RTR_ERROR;
}